

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O0

knote * knote_index_RB_REMOVE(knote_index *head,knote *elm)

{
  knote *pkVar1;
  undefined4 uVar2;
  knote *in_RSI;
  knote_index *in_RDI;
  knote *left;
  int color;
  knote *old;
  knote *parent;
  knote *child;
  knote *local_38;
  int local_2c;
  knote *local_20;
  knote *local_18;
  knote *local_10;
  
  if ((in_RSI->kn_index).rbe_left == (knote *)0x0) {
    local_18 = (in_RSI->kn_index).rbe_right;
  }
  else {
    if ((in_RSI->kn_index).rbe_right != (knote *)0x0) {
      pkVar1 = (in_RSI->kn_index).rbe_right;
      do {
        local_10 = pkVar1;
        pkVar1 = (local_10->kn_index).rbe_left;
      } while (pkVar1 != (knote *)0x0);
      local_18 = (local_10->kn_index).rbe_right;
      local_20 = (local_10->kn_index).rbe_parent;
      local_2c = (local_10->kn_index).rbe_color;
      if (local_18 != (knote *)0x0) {
        (local_18->kn_index).rbe_parent = local_20;
      }
      if (local_20 == (knote *)0x0) {
        in_RDI->rbh_root = local_18;
      }
      else if ((local_20->kn_index).rbe_left == local_10) {
        (local_20->kn_index).rbe_left = local_18;
      }
      else {
        (local_20->kn_index).rbe_right = local_18;
      }
      if ((local_10->kn_index).rbe_parent == in_RSI) {
        local_20 = local_10;
      }
      (local_10->kn_index).rbe_left = (in_RSI->kn_index).rbe_left;
      (local_10->kn_index).rbe_right = (in_RSI->kn_index).rbe_right;
      (local_10->kn_index).rbe_parent = (in_RSI->kn_index).rbe_parent;
      uVar2 = *(undefined4 *)&(in_RSI->kn_index).field_0x1c;
      (local_10->kn_index).rbe_color = (in_RSI->kn_index).rbe_color;
      *(undefined4 *)&(local_10->kn_index).field_0x1c = uVar2;
      if ((in_RSI->kn_index).rbe_parent == (knote *)0x0) {
        in_RDI->rbh_root = local_10;
      }
      else if ((((in_RSI->kn_index).rbe_parent)->kn_index).rbe_left == in_RSI) {
        (((in_RSI->kn_index).rbe_parent)->kn_index).rbe_left = local_10;
      }
      else {
        (((in_RSI->kn_index).rbe_parent)->kn_index).rbe_right = local_10;
      }
      (((in_RSI->kn_index).rbe_left)->kn_index).rbe_parent = local_10;
      if ((in_RSI->kn_index).rbe_right != (knote *)0x0) {
        (((in_RSI->kn_index).rbe_right)->kn_index).rbe_parent = local_10;
      }
      if (local_20 != (knote *)0x0) {
        local_38 = local_20;
        do {
          local_38 = (local_38->kn_index).rbe_parent;
        } while (local_38 != (knote *)0x0);
      }
      goto LAB_00104f90;
    }
    local_18 = (in_RSI->kn_index).rbe_left;
  }
  local_20 = (in_RSI->kn_index).rbe_parent;
  local_2c = (in_RSI->kn_index).rbe_color;
  if (local_18 != (knote *)0x0) {
    (local_18->kn_index).rbe_parent = local_20;
  }
  if (local_20 == (knote *)0x0) {
    in_RDI->rbh_root = local_18;
  }
  else if ((local_20->kn_index).rbe_left == in_RSI) {
    (local_20->kn_index).rbe_left = local_18;
  }
  else {
    (local_20->kn_index).rbe_right = local_18;
  }
LAB_00104f90:
  if (local_2c == 0) {
    knote_index_RB_REMOVE_COLOR(in_RDI,local_20,local_18);
  }
  return in_RSI;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}